

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::program_parameteri(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLuint local_1c;
  GLuint local_18;
  GLuint notAProgram;
  GLuint shader;
  GLuint program;
  NegativeTestContext *ctx_local;
  
  _shader = ctx;
  notAProgram = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  local_18 = glu::CallLogWrapper::glCreateShader(&_shader->super_CallLogWrapper,0x8b31);
  local_1c = glu::CallLogWrapper::glCreateProgram(&_shader->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteProgram(&_shader->super_CallLogWrapper,local_1c);
  pNVar1 = _shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if program is not the name of an existing program object."
             ,&local_41);
  NegativeTestContext::beginSection(pNVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glProgramParameteri(&_shader->super_CallLogWrapper,local_1c,0x8257,1);
  NegativeTestContext::expectError(_shader,0x501);
  NegativeTestContext::endSection(_shader);
  pNVar1 = _shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_OPERATION is generated if program is the name of a shader object.",
             &local_79);
  NegativeTestContext::beginSection(pNVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glProgramParameteri(&_shader->super_CallLogWrapper,local_18,0x8257,1);
  NegativeTestContext::expectError(_shader,0x502);
  NegativeTestContext::endSection(_shader);
  pNVar1 = _shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "GL_INVALID_ENUM is generated if pname is not GL_PROGRAM_BINARY_RETRIEVABLE_HINT or PROGRAM_SEPARABLE."
             ,&local_a1);
  NegativeTestContext::beginSection(pNVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  glu::CallLogWrapper::glProgramParameteri(&_shader->super_CallLogWrapper,notAProgram,0xffffffff,1);
  NegativeTestContext::expectError(_shader,0x500);
  NegativeTestContext::endSection(_shader);
  pNVar1 = _shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "GL_INVALID_VALUE is generated if value is not GL_FALSE or GL_TRUE.",&local_c9);
  NegativeTestContext::beginSection(pNVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  glu::CallLogWrapper::glProgramParameteri(&_shader->super_CallLogWrapper,notAProgram,0x8257,2);
  NegativeTestContext::expectError(_shader,0x501);
  NegativeTestContext::endSection(_shader);
  glu::CallLogWrapper::glDeleteProgram(&_shader->super_CallLogWrapper,notAProgram);
  glu::CallLogWrapper::glDeleteShader(&_shader->super_CallLogWrapper,local_18);
  return;
}

Assistant:

void program_parameteri (NegativeTestContext& ctx)
{
	GLuint program	= ctx.glCreateProgram();
	GLuint shader	= ctx.glCreateShader(GL_VERTEX_SHADER);

	const GLuint notAProgram = ctx.glCreateProgram();
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not the name of an existing program object.");
	ctx.glProgramParameteri(notAProgram, GL_PROGRAM_BINARY_RETRIEVABLE_HINT, GL_TRUE);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is the name of a shader object.");
	ctx.glProgramParameteri(shader, GL_PROGRAM_BINARY_RETRIEVABLE_HINT, GL_TRUE);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not GL_PROGRAM_BINARY_RETRIEVABLE_HINT or PROGRAM_SEPARABLE.");
	ctx.glProgramParameteri(program, -1, GL_TRUE);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if value is not GL_FALSE or GL_TRUE.");
	ctx.glProgramParameteri(program, GL_PROGRAM_BINARY_RETRIEVABLE_HINT, 2);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteProgram(program);
	ctx.glDeleteShader(shader);
}